

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O0

Cookie * Curl_cookie_add(Curl_easy *data,CookieInfo *c,_Bool httpheader,_Bool noexpire,char *lineptr
                        ,char *domain,char *path,_Bool secure)

{
  _Bool _Var1;
  int iVar2;
  CURLofft CVar3;
  time_t tVar4;
  time_t tVar5;
  char *pcVar6;
  size_t sVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  char *local_2130;
  char **local_2120;
  char *sep_1;
  size_t cllen;
  int acceptable;
  int fields;
  char *tok_buf;
  char *firstptr;
  char *ptr_1;
  size_t pathlen;
  char *endslash;
  char *queryp;
  CURLofft offt;
  _Bool is_ip;
  char *endofn;
  size_t nlen;
  size_t len;
  _Bool sep;
  char **ppcStack_2098;
  _Bool done;
  char *whatptr;
  size_t linelength;
  char *semiptr;
  char *ptr;
  char what [4096];
  char name [4096];
  size_t myhash;
  _Bool badcookie;
  _Bool replace_old;
  time_t now;
  Cookie *lastc;
  Cookie *co;
  Cookie *clist;
  char **ppcStack_38;
  _Bool secure_local;
  char *domain_local;
  char *lineptr_local;
  _Bool noexpire_local;
  _Bool httpheader_local;
  CookieInfo *c_local;
  Curl_easy *data_local;
  
  now = 0;
  tVar4 = time((time_t *)0x0);
  bVar10 = false;
  lastc = (Cookie *)(*Curl_ccalloc)(1,0x60);
  if (lastc == (Cookie *)0x0) {
    return (Cookie *)0x0;
  }
  ppcStack_38 = (char **)domain;
  domain_local = lineptr;
  if (httpheader) {
    whatptr = (char *)strlen(lineptr);
    if ((char *)0x1388 < whatptr) {
      (*Curl_cfree)(lastc);
      return (Cookie *)0x0;
    }
    linelength = (size_t)strchr(lineptr,0x3b);
    while( true ) {
      bVar8 = false;
      if ((*domain_local != '\0') && (bVar8 = true, *domain_local != ' ')) {
        bVar8 = *domain_local == '\t';
      }
      if (!bVar8) break;
      domain_local = domain_local + 1;
    }
    semiptr = domain_local;
    do {
      ptr._0_1_ = 0;
      what[0xff8] = '\0';
      iVar2 = __isoc99_sscanf(semiptr,"%4095[^;\r\n=] =%4095[^;\r\n]",what + 0xff8,&ptr);
      if (0 < iVar2) {
        len._7_1_ = 0;
        nlen = strlen((char *)&ptr);
        endofn = (char *)strlen(what + 0xff8);
        _offt = semiptr + (long)endofn;
        if ((((char *)0xffe < endofn) || (0xffe < nlen)) || ((char *)0x1000 < endofn + nlen)) {
          freecookie(lastc);
          Curl_infof(data,"oversized cookie dropped, name/val %zu + %zu bytes\n",endofn,nlen);
          return (Cookie *)0x0;
        }
        len._6_1_ = *_offt == '=';
        if (endofn != (char *)0x0) {
          _offt = _offt + -1;
          bVar8 = true;
          if (*_offt != ' ') {
            bVar8 = *_offt == '\t';
          }
          if (bVar8) {
            while( true ) {
              bVar8 = false;
              if (*_offt != '\0') {
                bVar9 = true;
                if (*_offt != ' ') {
                  bVar9 = *_offt == '\t';
                }
                bVar8 = false;
                if (bVar9) {
                  bVar8 = endofn != (char *)0x0;
                }
              }
              if (!bVar8) break;
              _offt = _offt + -1;
              endofn = endofn + -1;
            }
            (what + 0xff8)[(long)endofn] = '\0';
          }
        }
        while( true ) {
          bVar8 = false;
          if ((nlen != 0) && (bVar8 = true, *(char *)((long)&semiptr + nlen + 7) != ' ')) {
            bVar8 = *(char *)((long)&semiptr + nlen + 7) == '\t';
          }
          if (!bVar8) break;
          *(undefined1 *)((long)&semiptr + nlen + 7) = 0;
          nlen = nlen - 1;
        }
        ppcStack_2098 = &ptr;
        while( true ) {
          bVar8 = false;
          if ((*(char *)ppcStack_2098 != '\0') && (bVar8 = true, *(char *)ppcStack_2098 != ' ')) {
            bVar8 = *(char *)ppcStack_2098 == '\t';
          }
          if (!bVar8) break;
          ppcStack_2098 = (char **)((long)ppcStack_2098 + 1);
        }
        if (lastc->name == (char *)0x0) {
          if ((len._6_1_ & 1) == 0) {
            bVar10 = true;
            break;
          }
          pcVar6 = (*Curl_cstrdup)(what + 0xff8);
          lastc->name = pcVar6;
          pcVar6 = (*Curl_cstrdup)((char *)ppcStack_2098);
          lastc->value = pcVar6;
          len._7_1_ = 1;
          if ((lastc->name == (char *)0x0) || (lastc->value == (char *)0x0)) {
            bVar10 = true;
            break;
          }
        }
        else if (nlen == 0) {
          len._7_1_ = 1;
          iVar2 = Curl_strcasecompare("secure",what + 0xff8);
          if (iVar2 == 0) {
            iVar2 = Curl_strcasecompare("httponly",what + 0xff8);
            if (iVar2 == 0) {
              if ((len._6_1_ & 1) != 0) {
                len._7_1_ = 0;
              }
            }
            else {
              lastc->httponly = true;
            }
          }
          else {
            if ((!secure) && ((c->running & 1U) != 0)) {
              bVar10 = true;
              break;
            }
            lastc->secure = true;
          }
        }
        if ((len._7_1_ & 1) == 0) {
          iVar2 = Curl_strcasecompare("path",what + 0xff8);
          if (iVar2 == 0) {
            iVar2 = Curl_strcasecompare("domain",what + 0xff8);
            if (iVar2 == 0) {
              iVar2 = Curl_strcasecompare("version",what + 0xff8);
              if (iVar2 == 0) {
                iVar2 = Curl_strcasecompare("max-age",what + 0xff8);
                if (iVar2 == 0) {
                  iVar2 = Curl_strcasecompare("expires",what + 0xff8);
                  if ((iVar2 != 0) &&
                     (strstore(&lastc->expirestr,(char *)ppcStack_2098),
                     lastc->expirestr == (char *)0x0)) {
                    bVar10 = true;
                    break;
                  }
                }
                else {
                  strstore(&lastc->maxage,(char *)ppcStack_2098);
                  if (lastc->maxage == (char *)0x0) {
                    bVar10 = true;
                    break;
                  }
                }
              }
              else {
                strstore(&lastc->version,(char *)ppcStack_2098);
                if (lastc->version == (char *)0x0) {
                  bVar10 = true;
                  break;
                }
              }
            }
            else {
              if (*(char *)ppcStack_2098 == '.') {
                ppcStack_2098 = (char **)((long)ppcStack_2098 + 1);
              }
              _Var1 = bad_domain((char *)ppcStack_2098);
              if (_Var1) {
                ppcStack_38 = (char **)0x18a550;
              }
              if (ppcStack_38 == (char **)0x0) {
                local_2120 = ppcStack_2098;
              }
              else {
                local_2120 = ppcStack_38;
              }
              queryp._7_1_ = isip((char *)local_2120);
              if (((ppcStack_38 == (char **)0x0) ||
                  (((bool)queryp._7_1_ &&
                   (iVar2 = strcmp((char *)ppcStack_2098,(char *)ppcStack_38), iVar2 == 0)))) ||
                 (((queryp._7_1_ & 1) == 0 &&
                  (_Var1 = tailmatch((char *)ppcStack_2098,(char *)ppcStack_38), _Var1)))) {
                strstore(&lastc->domain,(char *)ppcStack_2098);
                if (lastc->domain == (char *)0x0) {
                  bVar10 = true;
                  break;
                }
                if ((queryp._7_1_ & 1) == 0) {
                  lastc->tailmatch = true;
                }
              }
              else {
                bVar10 = true;
                Curl_infof(data,"skipped cookie with bad tailmatch domain: %s\n",ppcStack_2098);
              }
            }
          }
          else {
            strstore(&lastc->path,(char *)ppcStack_2098);
            if (lastc->path == (char *)0x0) {
              bVar10 = true;
              break;
            }
            (*Curl_cfree)(lastc->spath);
            pcVar6 = sanitize_cookie_path(lastc->path);
            lastc->spath = pcVar6;
            if (lastc->spath == (char *)0x0) {
              bVar10 = true;
              break;
            }
          }
        }
      }
      if ((linelength == 0) || (pcVar6 = (char *)linelength, *(char *)linelength == '\0')) {
        linelength = 0;
      }
      else {
        do {
          semiptr = pcVar6 + 1;
          bVar8 = false;
          if ((*semiptr != '\0') && (bVar8 = true, *semiptr != ' ')) {
            bVar8 = *semiptr == '\t';
          }
          pcVar6 = semiptr;
        } while (bVar8);
        linelength = (size_t)strchr(semiptr,0x3b);
        if (((char *)linelength == (char *)0x0) && (*semiptr != '\0')) {
          linelength = (size_t)strchr(semiptr,0);
        }
      }
    } while (linelength != 0);
    if (lastc->maxage == (char *)0x0) {
      if (lastc->expirestr != (char *)0x0) {
        tVar5 = curl_getdate(lastc->expirestr,(time_t *)0x0);
        lastc->expires = tVar5;
        if (lastc->expires == 0) {
          lastc->expires = 1;
        }
        else if (lastc->expires < 0) {
          lastc->expires = 0;
        }
      }
    }
    else {
      if (*lastc->maxage == '\"') {
        local_2130 = lastc->maxage + 1;
      }
      else {
        local_2130 = lastc->maxage;
      }
      queryp._0_4_ = curlx_strtoofft(local_2130,(char **)0x0,10,&lastc->expires);
      if ((CURLofft)queryp == CURL_OFFT_FLOW) {
        lastc->expires = 0x7fffffffffffffff;
      }
      else if ((CURLofft)queryp == CURL_OFFT_OK) {
        if (lastc->expires == 0) {
          lastc->expires = 1;
        }
        else if (0x7fffffffffffffff - tVar4 < lastc->expires) {
          lastc->expires = 0x7fffffffffffffff;
        }
        else {
          lastc->expires = tVar4 + lastc->expires;
        }
      }
    }
    if (((!bVar10) && (lastc->domain == (char *)0x0)) && (ppcStack_38 != (char **)0x0)) {
      pcVar6 = (*Curl_cstrdup)((char *)ppcStack_38);
      lastc->domain = pcVar6;
      if (lastc->domain == (char *)0x0) {
        bVar10 = true;
      }
    }
    if (((!bVar10) && (lastc->path == (char *)0x0)) && (path != (char *)0x0)) {
      endslash = strchr(path,0x3f);
      if (endslash == (char *)0x0) {
        pathlen = (size_t)strrchr(path,0x2f);
      }
      else {
        pathlen = (size_t)Curl_memrchr(path,0x2f,(long)endslash - (long)path);
      }
      if (pathlen != 0) {
        ptr_1 = (char *)((pathlen - (long)path) + 1);
        pcVar6 = (char *)(*Curl_cmalloc)((pathlen - (long)path) + 2);
        lastc->path = pcVar6;
        if (lastc->path == (char *)0x0) {
          bVar10 = true;
        }
        else {
          memcpy(lastc->path,path,(size_t)ptr_1);
          lastc->path[(long)ptr_1] = '\0';
          pcVar6 = sanitize_cookie_path(lastc->path);
          lastc->spath = pcVar6;
          if (lastc->spath == (char *)0x0) {
            bVar10 = true;
          }
        }
      }
    }
    if ((bVar10) || (lastc->name == (char *)0x0)) {
      freecookie(lastc);
      return (Cookie *)0x0;
    }
  }
  else {
    _acceptable = (char *)0x0;
    iVar2 = strncmp(lineptr,"#HttpOnly_",10);
    if (iVar2 == 0) {
      domain_local = lineptr + 10;
      lastc->httponly = true;
    }
    if (*domain_local == '#') {
      (*Curl_cfree)(lastc);
      return (Cookie *)0x0;
    }
    firstptr = strchr(domain_local,0xd);
    if (firstptr != (char *)0x0) {
      *firstptr = '\0';
    }
    firstptr = strchr(domain_local,10);
    if (firstptr != (char *)0x0) {
      *firstptr = '\0';
    }
    tok_buf = strtok_r(domain_local,"\t",(char **)&acceptable);
    cllen._4_4_ = 0;
    firstptr = tok_buf;
    while( true ) {
      bVar8 = false;
      if (firstptr != (char *)0x0) {
        bVar8 = (bool)(bVar10 ^ 1);
      }
      if (!bVar8) break;
      switch(cllen._4_4_) {
      case 0:
        if (*firstptr == '.') {
          firstptr = firstptr + 1;
        }
        pcVar6 = (*Curl_cstrdup)(firstptr);
        lastc->domain = pcVar6;
        if (lastc->domain == (char *)0x0) {
          bVar10 = true;
        }
        else {
          _Var1 = bad_domain(lastc->domain);
          if (_Var1) {
            bVar10 = true;
          }
        }
        break;
      case 1:
        iVar2 = Curl_strcasecompare(firstptr,"TRUE");
        lastc->tailmatch = iVar2 != 0;
        break;
      case 2:
        iVar2 = strcmp("TRUE",firstptr);
        if ((iVar2 == 0) || (iVar2 = strcmp("FALSE",firstptr), iVar2 == 0)) {
          pcVar6 = (*Curl_cstrdup)("/");
          lastc->path = pcVar6;
          if (lastc->path == (char *)0x0) {
            bVar10 = true;
          }
          pcVar6 = (*Curl_cstrdup)("/");
          lastc->spath = pcVar6;
          if (lastc->spath == (char *)0x0) {
            bVar10 = true;
          }
          cllen._4_4_ = cllen._4_4_ + 1;
          goto switchD_001115c1_caseD_3;
        }
        pcVar6 = (*Curl_cstrdup)(firstptr);
        lastc->path = pcVar6;
        if (lastc->path == (char *)0x0) {
          bVar10 = true;
        }
        else {
          pcVar6 = sanitize_cookie_path(lastc->path);
          lastc->spath = pcVar6;
          if (lastc->spath == (char *)0x0) {
            bVar10 = true;
          }
        }
        break;
      case 3:
switchD_001115c1_caseD_3:
        lastc->secure = false;
        iVar2 = Curl_strcasecompare(firstptr,"TRUE");
        if (iVar2 != 0) {
          if ((secure) || ((c->running & 1U) != 0)) {
            lastc->secure = true;
          }
          else {
            bVar10 = true;
          }
        }
        break;
      case 4:
        CVar3 = curlx_strtoofft(firstptr,(char **)0x0,10,&lastc->expires);
        if (CVar3 != CURL_OFFT_OK) {
          bVar10 = true;
        }
        break;
      case 5:
        pcVar6 = (*Curl_cstrdup)(firstptr);
        lastc->name = pcVar6;
        if (lastc->name == (char *)0x0) {
          bVar10 = true;
        }
        break;
      case 6:
        pcVar6 = (*Curl_cstrdup)(firstptr);
        lastc->value = pcVar6;
        if (lastc->value == (char *)0x0) {
          bVar10 = true;
        }
      }
      firstptr = strtok_r((char *)0x0,"\t",(char **)&acceptable);
      cllen._4_4_ = cllen._4_4_ + 1;
    }
    if (cllen._4_4_ == 6) {
      pcVar6 = (*Curl_cstrdup)("");
      lastc->value = pcVar6;
      if (lastc->value == (char *)0x0) {
        bVar10 = true;
      }
      else {
        cllen._4_4_ = 7;
      }
    }
    if ((!bVar10) && (cllen._4_4_ != 7)) {
      bVar10 = true;
    }
    if (bVar10) {
      freecookie(lastc);
      return (Cookie *)0x0;
    }
  }
  if ((((c->running & 1U) == 0) && ((c->newsession & 1U) != 0)) && (lastc->expires == 0)) {
    freecookie(lastc);
  }
  else {
    lastc->livecookie = (_Bool)(c->running & 1);
    iVar2 = c->lastct + 1;
    c->lastct = iVar2;
    lastc->creationtime = iVar2;
    if (!noexpire) {
      remove_expired(c);
    }
    if (((ppcStack_38 == (char **)0x0) || (lastc->domain == (char *)0x0)) ||
       ((_Var1 = isip(lastc->domain), _Var1 ||
        (_Var1 = bad_domain(lastc->domain), ((_Var1 ^ 0xffU) & 1) != 0)))) {
      sVar7 = cookiehash(lastc->domain);
      co = c->cookies[sVar7];
      bVar10 = false;
      do {
        if (co == (Cookie *)0x0) goto LAB_00111d11;
        iVar2 = Curl_strcasecompare(co->name,lastc->name);
        if (iVar2 != 0) {
          if ((co->domain == (char *)0x0) || (lastc->domain == (char *)0x0)) {
            if ((co->domain == (char *)0x0) && (lastc->domain == (char *)0x0)) {
              bVar10 = true;
            }
          }
          else {
            iVar2 = Curl_strcasecompare(co->domain,lastc->domain);
            if ((iVar2 != 0) && ((co->tailmatch & 1U) == (lastc->tailmatch & 1U))) {
              bVar10 = true;
            }
          }
          if (bVar10) {
            if ((co->spath == (char *)0x0) || (lastc->spath == (char *)0x0)) {
              if ((co->spath == (char *)0x0) && (lastc->spath == (char *)0x0)) {
                bVar10 = true;
              }
              else {
                bVar10 = false;
              }
            }
            else if ((((co->secure & 1U) == 0) || ((lastc->secure & 1U) != 0)) || (secure)) {
              iVar2 = Curl_strcasecompare(co->spath,lastc->spath);
              bVar10 = iVar2 != 0;
            }
            else {
              pcVar6 = strchr(co->spath + 1,0x2f);
              if (pcVar6 == (char *)0x0) {
                sep_1 = (char *)strlen(co->spath);
              }
              else {
                sep_1 = pcVar6 + -(long)co->spath;
              }
              iVar2 = Curl_strncasecompare(co->spath,lastc->spath,(size_t)sep_1);
              if (iVar2 != 0) {
                freecookie(lastc);
                return (Cookie *)0x0;
              }
            }
          }
          if (((bVar10) && ((lastc->livecookie & 1U) == 0)) && ((co->livecookie & 1U) != 0)) {
            freecookie(lastc);
            return (Cookie *)0x0;
          }
          if (bVar10) {
            lastc->next = co->next;
            lastc->creationtime = co->creationtime;
            (*Curl_cfree)(co->name);
            (*Curl_cfree)(co->value);
            (*Curl_cfree)(co->domain);
            (*Curl_cfree)(co->path);
            (*Curl_cfree)(co->spath);
            (*Curl_cfree)(co->expirestr);
            (*Curl_cfree)(co->version);
            (*Curl_cfree)(co->maxage);
            memcpy(co,lastc,0x60);
            (*Curl_cfree)(lastc);
            lastc = co;
            do {
              now = (time_t)co;
              co = co->next;
            } while (co != (Cookie *)0x0);
LAB_00111d11:
            if ((c->running & 1U) != 0) {
              pcVar6 = "Added";
              if (bVar10) {
                pcVar6 = "Replaced";
              }
              Curl_infof(data,"%s cookie %s=\"%s\" for domain %s, path %s, expire %ld\n",pcVar6,
                         lastc->name,lastc->value,lastc->domain,lastc->path,lastc->expires);
            }
            if (!bVar10) {
              if (now == 0) {
                c->cookies[sVar7] = lastc;
              }
              else {
                *(Cookie **)now = lastc;
              }
              c->numcookies = c->numcookies + 1;
            }
            return lastc;
          }
        }
        now = (time_t)co;
        co = co->next;
      } while( true );
    }
    Curl_infof(data,"cookie \'%s\' dropped, domain \'%s\' must not set cookies for \'%s\'\n",
               lastc->name,ppcStack_38,lastc->domain);
    freecookie(lastc);
  }
  return (Cookie *)0x0;
}

Assistant:

struct Cookie *
Curl_cookie_add(struct Curl_easy *data,
                /* The 'data' pointer here may be NULL at times, and thus
                   must only be used very carefully for things that can deal
                   with data being NULL. Such as infof() and similar */

                struct CookieInfo *c,
                bool httpheader, /* TRUE if HTTP header-style line */
                bool noexpire, /* if TRUE, skip remove_expired() */
                char *lineptr,   /* first character of the line */
                const char *domain, /* default domain */
                const char *path,   /* full path used when this cookie is set,
                                       used to get default path for the cookie
                                       unless set */
                bool secure)  /* TRUE if connection is over secure origin */
{
  struct Cookie *clist;
  struct Cookie *co;
  struct Cookie *lastc = NULL;
  time_t now = time(NULL);
  bool replace_old = FALSE;
  bool badcookie = FALSE; /* cookies are good by default. mmmmm yummy */
  size_t myhash;

#ifdef CURL_DISABLE_VERBOSE_STRINGS
  (void)data;
#endif

  /* First, alloc and init a new struct for it */
  co = calloc(1, sizeof(struct Cookie));
  if(!co)
    return NULL; /* bail out if we're this low on memory */

  if(httpheader) {
    /* This line was read off a HTTP-header */
    char name[MAX_NAME];
    char what[MAX_NAME];
    const char *ptr;
    const char *semiptr;

    size_t linelength = strlen(lineptr);
    if(linelength > MAX_COOKIE_LINE) {
      /* discard overly long lines at once */
      free(co);
      return NULL;
    }

    semiptr = strchr(lineptr, ';'); /* first, find a semicolon */

    while(*lineptr && ISBLANK(*lineptr))
      lineptr++;

    ptr = lineptr;
    do {
      /* we have a <what>=<this> pair or a stand-alone word here */
      name[0] = what[0] = 0; /* init the buffers */
      if(1 <= sscanf(ptr, "%" MAX_NAME_TXT "[^;\r\n=] =%"
                     MAX_NAME_TXT "[^;\r\n]",
                     name, what)) {
        /* Use strstore() below to properly deal with received cookie
           headers that have the same string property set more than once,
           and then we use the last one. */
        const char *whatptr;
        bool done = FALSE;
        bool sep;
        size_t len = strlen(what);
        size_t nlen = strlen(name);
        const char *endofn = &ptr[ nlen ];

        if(nlen >= (MAX_NAME-1) || len >= (MAX_NAME-1) ||
           ((nlen + len) > MAX_NAME)) {
          /* too long individual name or contents, or too long combination of
             name + contents. Chrome and Firefox support 4095 or 4096 bytes
             combo. */
          freecookie(co);
          infof(data, "oversized cookie dropped, name/val %zu + %zu bytes\n",
                nlen, len);
          return NULL;
        }

        /* name ends with a '=' ? */
        sep = (*endofn == '=')?TRUE:FALSE;

        if(nlen) {
          endofn--; /* move to the last character */
          if(ISBLANK(*endofn)) {
            /* skip trailing spaces in name */
            while(*endofn && ISBLANK(*endofn) && nlen) {
              endofn--;
              nlen--;
            }
            name[nlen] = 0; /* new end of name */
          }
        }

        /* Strip off trailing whitespace from the 'what' */
        while(len && ISBLANK(what[len-1])) {
          what[len-1] = 0;
          len--;
        }

        /* Skip leading whitespace from the 'what' */
        whatptr = what;
        while(*whatptr && ISBLANK(*whatptr))
          whatptr++;

        if(!co->name) {
          /* The very first name/value pair is the actual cookie name */
          if(!sep) {
            /* Bad name/value pair. */
            badcookie = TRUE;
            break;
          }
          co->name = strdup(name);
          co->value = strdup(whatptr);
          done = TRUE;
          if(!co->name || !co->value) {
            badcookie = TRUE;
            break;
          }
        }
        else if(!len) {
          /* this was a "<name>=" with no content, and we must allow
             'secure' and 'httponly' specified this weirdly */
          done = TRUE;
          /*
           * secure cookies are only allowed to be set when the connection is
           * using a secure protocol, or when the cookie is being set by
           * reading from file
           */
          if(strcasecompare("secure", name)) {
            if(secure || !c->running) {
              co->secure = TRUE;
            }
            else {
              badcookie = TRUE;
              break;
            }
          }
          else if(strcasecompare("httponly", name))
            co->httponly = TRUE;
          else if(sep)
            /* there was a '=' so we're not done parsing this field */
            done = FALSE;
        }
        if(done)
          ;
        else if(strcasecompare("path", name)) {
          strstore(&co->path, whatptr);
          if(!co->path) {
            badcookie = TRUE; /* out of memory bad */
            break;
          }
          free(co->spath); /* if this is set again */
          co->spath = sanitize_cookie_path(co->path);
          if(!co->spath) {
            badcookie = TRUE; /* out of memory bad */
            break;
          }
        }
        else if(strcasecompare("domain", name)) {
          bool is_ip;

          /* Now, we make sure that our host is within the given domain,
             or the given domain is not valid and thus cannot be set. */

          if('.' == whatptr[0])
            whatptr++; /* ignore preceding dot */

#ifndef USE_LIBPSL
          /*
           * Without PSL we don't know when the incoming cookie is set on a
           * TLD or otherwise "protected" suffix. To reduce risk, we require a
           * dot OR the exact host name being "localhost".
           */
          if(bad_domain(whatptr))
            domain = ":";
#endif

          is_ip = isip(domain ? domain : whatptr);

          if(!domain
             || (is_ip && !strcmp(whatptr, domain))
             || (!is_ip && tailmatch(whatptr, domain))) {
            strstore(&co->domain, whatptr);
            if(!co->domain) {
              badcookie = TRUE;
              break;
            }
            if(!is_ip)
              co->tailmatch = TRUE; /* we always do that if the domain name was
                                       given */
          }
          else {
            /* we did not get a tailmatch and then the attempted set domain
               is not a domain to which the current host belongs. Mark as
               bad. */
            badcookie = TRUE;
            infof(data, "skipped cookie with bad tailmatch domain: %s\n",
                  whatptr);
          }
        }
        else if(strcasecompare("version", name)) {
          strstore(&co->version, whatptr);
          if(!co->version) {
            badcookie = TRUE;
            break;
          }
        }
        else if(strcasecompare("max-age", name)) {
          /* Defined in RFC2109:

             Optional.  The Max-Age attribute defines the lifetime of the
             cookie, in seconds.  The delta-seconds value is a decimal non-
             negative integer.  After delta-seconds seconds elapse, the
             client should discard the cookie.  A value of zero means the
             cookie should be discarded immediately.

          */
          strstore(&co->maxage, whatptr);
          if(!co->maxage) {
            badcookie = TRUE;
            break;
          }
        }
        else if(strcasecompare("expires", name)) {
          strstore(&co->expirestr, whatptr);
          if(!co->expirestr) {
            badcookie = TRUE;
            break;
          }
        }
        /*
          else this is the second (or more) name we don't know
          about! */
      }
      else {
        /* this is an "illegal" <what>=<this> pair */
      }

      if(!semiptr || !*semiptr) {
        /* we already know there are no more cookies */
        semiptr = NULL;
        continue;
      }

      ptr = semiptr + 1;
      while(*ptr && ISBLANK(*ptr))
        ptr++;
      semiptr = strchr(ptr, ';'); /* now, find the next semicolon */

      if(!semiptr && *ptr)
        /* There are no more semicolons, but there's a final name=value pair
           coming up */
        semiptr = strchr(ptr, '\0');
    } while(semiptr);

    if(co->maxage) {
      CURLofft offt;
      offt = curlx_strtoofft((*co->maxage == '\"')?
                             &co->maxage[1]:&co->maxage[0], NULL, 10,
                             &co->expires);
      if(offt == CURL_OFFT_FLOW)
        /* overflow, used max value */
        co->expires = CURL_OFF_T_MAX;
      else if(!offt) {
        if(!co->expires)
          /* already expired */
          co->expires = 1;
        else if(CURL_OFF_T_MAX - now < co->expires)
          /* would overflow */
          co->expires = CURL_OFF_T_MAX;
        else
          co->expires += now;
      }
    }
    else if(co->expirestr) {
      /* Note that if the date couldn't get parsed for whatever reason,
         the cookie will be treated as a session cookie */
      co->expires = curl_getdate(co->expirestr, NULL);

      /* Session cookies have expires set to 0 so if we get that back
         from the date parser let's add a second to make it a
         non-session cookie */
      if(co->expires == 0)
        co->expires = 1;
      else if(co->expires < 0)
        co->expires = 0;
    }

    if(!badcookie && !co->domain) {
      if(domain) {
        /* no domain was given in the header line, set the default */
        co->domain = strdup(domain);
        if(!co->domain)
          badcookie = TRUE;
      }
    }

    if(!badcookie && !co->path && path) {
      /* No path was given in the header line, set the default.
         Note that the passed-in path to this function MAY have a '?' and
         following part that MUST not be stored as part of the path. */
      char *queryp = strchr(path, '?');

      /* queryp is where the interesting part of the path ends, so now we
         want to the find the last */
      char *endslash;
      if(!queryp)
        endslash = strrchr(path, '/');
      else
        endslash = memrchr(path, '/', (queryp - path));
      if(endslash) {
        size_t pathlen = (endslash-path + 1); /* include end slash */
        co->path = malloc(pathlen + 1); /* one extra for the zero byte */
        if(co->path) {
          memcpy(co->path, path, pathlen);
          co->path[pathlen] = 0; /* zero terminate */
          co->spath = sanitize_cookie_path(co->path);
          if(!co->spath)
            badcookie = TRUE; /* out of memory bad */
        }
        else
          badcookie = TRUE;
      }
    }

    if(badcookie || !co->name) {
      /* we didn't get a cookie name or a bad one,
         this is an illegal line, bail out */
      freecookie(co);
      return NULL;
    }

  }
  else {
    /* This line is NOT a HTTP header style line, we do offer support for
       reading the odd netscape cookies-file format here */
    char *ptr;
    char *firstptr;
    char *tok_buf = NULL;
    int fields;

    /* IE introduced HTTP-only cookies to prevent XSS attacks. Cookies
       marked with httpOnly after the domain name are not accessible
       from javascripts, but since curl does not operate at javascript
       level, we include them anyway. In Firefox's cookie files, these
       lines are preceded with #HttpOnly_ and then everything is
       as usual, so we skip 10 characters of the line..
    */
    if(strncmp(lineptr, "#HttpOnly_", 10) == 0) {
      lineptr += 10;
      co->httponly = TRUE;
    }

    if(lineptr[0]=='#') {
      /* don't even try the comments */
      free(co);
      return NULL;
    }
    /* strip off the possible end-of-line characters */
    ptr = strchr(lineptr, '\r');
    if(ptr)
      *ptr = 0; /* clear it */
    ptr = strchr(lineptr, '\n');
    if(ptr)
      *ptr = 0; /* clear it */

    firstptr = strtok_r(lineptr, "\t", &tok_buf); /* tokenize it on the TAB */

    /* Now loop through the fields and init the struct we already have
       allocated */
    for(ptr = firstptr, fields = 0; ptr && !badcookie;
        ptr = strtok_r(NULL, "\t", &tok_buf), fields++) {
      switch(fields) {
      case 0:
        if(ptr[0]=='.') /* skip preceding dots */
          ptr++;
        co->domain = strdup(ptr);
        if(!co->domain)
          badcookie = TRUE;
        else if(bad_domain(co->domain))
          badcookie = TRUE;
        break;
      case 1:
        /* This field got its explanation on the 23rd of May 2001 by
           Andr�s Garc�a:

           flag: A TRUE/FALSE value indicating if all machines within a given
           domain can access the variable. This value is set automatically by
           the browser, depending on the value you set for the domain.

           As far as I can see, it is set to true when the cookie says
           .domain.com and to false when the domain is complete www.domain.com
        */
        co->tailmatch = strcasecompare(ptr, "TRUE")?TRUE:FALSE;
        break;
      case 2:
        /* It turns out, that sometimes the file format allows the path
           field to remain not filled in, we try to detect this and work
           around it! Andr�s Garc�a made us aware of this... */
        if(strcmp("TRUE", ptr) && strcmp("FALSE", ptr)) {
          /* only if the path doesn't look like a boolean option! */
          co->path = strdup(ptr);
          if(!co->path)
            badcookie = TRUE;
          else {
            co->spath = sanitize_cookie_path(co->path);
            if(!co->spath) {
              badcookie = TRUE; /* out of memory bad */
            }
          }
          break;
        }
        /* this doesn't look like a path, make one up! */
        co->path = strdup("/");
        if(!co->path)
          badcookie = TRUE;
        co->spath = strdup("/");
        if(!co->spath)
          badcookie = TRUE;
        fields++; /* add a field and fall down to secure */
        /* FALLTHROUGH */
      case 3:
        co->secure = FALSE;
        if(strcasecompare(ptr, "TRUE")) {
          if(secure || c->running)
            co->secure = TRUE;
          else
            badcookie = TRUE;
        }
        break;
      case 4:
        if(curlx_strtoofft(ptr, NULL, 10, &co->expires))
          badcookie = TRUE;
        break;
      case 5:
        co->name = strdup(ptr);
        if(!co->name)
          badcookie = TRUE;
        break;
      case 6:
        co->value = strdup(ptr);
        if(!co->value)
          badcookie = TRUE;
        break;
      }
    }
    if(6 == fields) {
      /* we got a cookie with blank contents, fix it */
      co->value = strdup("");
      if(!co->value)
        badcookie = TRUE;
      else
        fields++;
    }

    if(!badcookie && (7 != fields))
      /* we did not find the sufficient number of fields */
      badcookie = TRUE;

    if(badcookie) {
      freecookie(co);
      return NULL;
    }

  }

  if(!c->running &&    /* read from a file */
     c->newsession &&  /* clean session cookies */
     !co->expires) {   /* this is a session cookie since it doesn't expire! */
    freecookie(co);
    return NULL;
  }

  co->livecookie = c->running;
  co->creationtime = ++c->lastct;

  /* now, we have parsed the incoming line, we must now check if this
     supersedes an already existing cookie, which it may if the previous have
     the same domain and path as this */

  /* at first, remove expired cookies */
  if(!noexpire)
    remove_expired(c);

  if(domain && co->domain && !isip(co->domain)) {
    int acceptable;
#ifdef USE_LIBPSL
    const psl_ctx_t *psl = Curl_psl_use(data);

    /* Check if the domain is a Public Suffix and if yes, ignore the cookie. */
    if(psl) {
      acceptable = psl_is_cookie_domain_acceptable(psl, domain, co->domain);
      Curl_psl_release(data);
    }
    else
#endif
    /* Without libpsl, do the best we can. */
    acceptable = !bad_domain(co->domain);

    if(!acceptable) {
      infof(data, "cookie '%s' dropped, domain '%s' must not "
                  "set cookies for '%s'\n", co->name, domain, co->domain);
      freecookie(co);
      return NULL;
    }
  }

  myhash = cookiehash(co->domain);
  clist = c->cookies[myhash];
  replace_old = FALSE;
  while(clist) {
    if(strcasecompare(clist->name, co->name)) {
      /* the names are identical */

      if(clist->domain && co->domain) {
        if(strcasecompare(clist->domain, co->domain) &&
          (clist->tailmatch == co->tailmatch))
          /* The domains are identical */
          replace_old = TRUE;
      }
      else if(!clist->domain && !co->domain)
        replace_old = TRUE;

      if(replace_old) {
        /* the domains were identical */

        if(clist->spath && co->spath) {
          if(clist->secure && !co->secure && !secure) {
            size_t cllen;
            const char *sep;

            /*
             * A non-secure cookie may not overlay an existing secure cookie.
             * For an existing cookie "a" with path "/login", refuse a new
             * cookie "a" with for example path "/login/en", while the path
             * "/loginhelper" is ok.
             */

            sep = strchr(clist->spath + 1, '/');

            if(sep)
              cllen = sep - clist->spath;
            else
              cllen = strlen(clist->spath);

            if(strncasecompare(clist->spath, co->spath, cllen)) {
              freecookie(co);
              return NULL;
            }
          }
          else if(strcasecompare(clist->spath, co->spath))
            replace_old = TRUE;
          else
            replace_old = FALSE;
        }
        else if(!clist->spath && !co->spath)
          replace_old = TRUE;
        else
          replace_old = FALSE;

      }

      if(replace_old && !co->livecookie && clist->livecookie) {
        /* Both cookies matched fine, except that the already present
           cookie is "live", which means it was set from a header, while
           the new one isn't "live" and thus only read from a file. We let
           live cookies stay alive */

        /* Free the newcomer and get out of here! */
        freecookie(co);
        return NULL;
      }

      if(replace_old) {
        co->next = clist->next; /* get the next-pointer first */

        /* when replacing, creationtime is kept from old */
        co->creationtime = clist->creationtime;

        /* then free all the old pointers */
        free(clist->name);
        free(clist->value);
        free(clist->domain);
        free(clist->path);
        free(clist->spath);
        free(clist->expirestr);
        free(clist->version);
        free(clist->maxage);

        *clist = *co;  /* then store all the new data */

        free(co);   /* free the newly alloced memory */
        co = clist; /* point to the previous struct instead */

        /* We have replaced a cookie, now skip the rest of the list but
           make sure the 'lastc' pointer is properly set */
        do {
          lastc = clist;
          clist = clist->next;
        } while(clist);
        break;
      }
    }
    lastc = clist;
    clist = clist->next;
  }

  if(c->running)
    /* Only show this when NOT reading the cookies from a file */
    infof(data, "%s cookie %s=\"%s\" for domain %s, path %s, "
          "expire %" CURL_FORMAT_CURL_OFF_T "\n",
          replace_old?"Replaced":"Added", co->name, co->value,
          co->domain, co->path, co->expires);

  if(!replace_old) {
    /* then make the last item point on this new one */
    if(lastc)
      lastc->next = co;
    else
      c->cookies[myhash] = co;
    c->numcookies++; /* one more cookie in the jar */
  }

  return co;
}